

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetField
               (uint32 field_number,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  bool bVar1;
  Type TVar2;
  Message *value;
  LogMessage *other;
  UnknownFieldSet *unknown_fields;
  Reflection *this;
  LogMessage local_70;
  LogFinisher local_31;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  if (field == (FieldDescriptor *)0x0) {
    unknown_fields = Reflection::MutableUnknownFields(this,message);
    bVar1 = SkipMessageSetField(input,field_number,unknown_fields);
    return bVar1;
  }
  if (*(int *)(field + 0x3c) != 3) {
    TVar2 = FieldDescriptor::type(field);
    if (TVar2 == TYPE_MESSAGE) {
      value = Reflection::MutableMessage(this,message,field,input->extension_factory_);
      bVar1 = WireFormatLite::ReadMessage<google::protobuf::Message>(input,value);
      return bVar1;
    }
  }
  LogMessage::LogMessage
            (&local_70,LOGLEVEL_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/wire_format.cc"
             ,0x196);
  other = LogMessage::operator<<(&local_70,"Extensions of MessageSets must be optional messages.");
  LogFinisher::operator=(&local_31,other);
  LogMessage::~LogMessage(&local_70);
  return false;
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetField(uint32 field_number,
                                              const FieldDescriptor* field,
                                              Message* message,
                                              io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();
  if (field == NULL) {
    // We store unknown MessageSet extensions as groups.
    return SkipMessageSetField(
        input, field_number, message_reflection->MutableUnknownFields(message));
  } else if (field->is_repeated() ||
             field->type() != FieldDescriptor::TYPE_MESSAGE) {
    // This shouldn't happen as we only allow optional message extensions to
    // MessageSet.
    GOOGLE_LOG(ERROR) << "Extensions of MessageSets must be optional messages.";
    return false;
  } else {
    Message* sub_message = message_reflection->MutableMessage(
        message, field, input->GetExtensionFactory());
    return WireFormatLite::ReadMessage(input, sub_message);
  }
}